

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O0

void * phmap::priv::Allocate<8ul,std::allocator<unsigned_long>>
                 (allocator<unsigned_long> *alloc,size_t n)

{
  pointer pMVar1;
  long in_RSI;
  void *p;
  A mem_alloc;
  allocator<unsigned_long> *in_stack_ffffffffffffffa8;
  allocator<M> *in_stack_ffffffffffffffb0;
  
  if (in_RSI == 0) {
    __assert_fail("n && \"n must be positive\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap_base.h"
                  ,0x120f,
                  "void *phmap::priv::Allocate(Alloc *, size_t) [Alignment = 8UL, Alloc = std::allocator<unsigned long>]"
                 );
  }
  std::allocator<M>::allocator<unsigned_long>(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  pMVar1 = allocator_traits<std::allocator<M>_>::allocate
                     (in_stack_ffffffffffffffb0,(size_type)in_stack_ffffffffffffffa8);
  if (((ulong)pMVar1 & 7) != 0) {
    __assert_fail("reinterpret_cast<uintptr_t>(p) % Alignment == 0 && \"allocator does not respect alignment\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap_base.h"
                  ,0x1216,
                  "void *phmap::priv::Allocate(Alloc *, size_t) [Alignment = 8UL, Alloc = std::allocator<unsigned long>]"
                 );
  }
  std::allocator<M>::~allocator((allocator<M> *)0x5e9881);
  return pMVar1;
}

Assistant:

void* Allocate(Alloc* alloc, size_t n)
		{
			static_assert(Alignment > 0, "");
			assert(n && "n must be positive");
			struct alignas(Alignment) M {};
			using A = typename phmap::allocator_traits<Alloc>::template rebind_alloc<M>;
			using AT = typename phmap::allocator_traits<Alloc>::template rebind_traits<M>;
			A mem_alloc(*alloc);
			void* p = AT::allocate(mem_alloc, (n + sizeof(M) - 1) / sizeof(M));
			assert(reinterpret_cast<uintptr_t>(p) % Alignment == 0 &&
			       "allocator does not respect alignment");
			return p;
		}